

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::Clean
          (StorageMultisampleTest *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar4;
  long lVar5;
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    if (this->m_rbo[lVar5] != 0) {
      (**(code **)(lVar3 + 0x460))(1,this->m_rbo + lVar5);
      this->m_rbo[lVar5] = 0;
    }
    if (this->m_fbo[lVar5] != 0) {
      (**(code **)(lVar3 + 0x440))(1,this->m_fbo + lVar5);
      this->m_fbo[lVar5] = 0;
    }
    lVar5 = 1;
    bVar1 = false;
  } while (bVar4);
  (**(code **)(lVar3 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar3 + 0x1c8))(0x3ff0000000000000);
  (**(code **)(lVar3 + 0x208))(0);
  do {
    iVar2 = (**(code **)(lVar3 + 0x800))();
  } while (iVar2 != 0);
  return;
}

Assistant:

void StorageMultisampleTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release objects. */
	for (glw::GLuint i = 0; i < 2; ++i)
	{
		if (m_rbo[i])
		{
			gl.deleteRenderbuffers(1, &m_rbo[i]);

			m_rbo[i] = 0;
		}

		if (m_fbo[i])
		{
			gl.deleteFramebuffers(1, &m_fbo[i]);

			m_fbo[i] = 0;
		}
	}

	/* Returning to default clear values. */
	gl.clearColor(0.f, 0.f, 0.f, 0.f);
	gl.clearDepth(1.f);
	gl.clearStencil(0);

	/* Errors clean up. */
	while (gl.getError())
		;
}